

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uecc.c
# Opt level: O0

int secp256r1_key_exchange
              (ptls_key_exchange_algorithm_t *algo,ptls_iovec_t *pubkey,ptls_iovec_t *secret,
              ptls_iovec_t peerkey)

{
  int iVar1;
  uECC_Curve puVar2;
  ptls_iovec_t pVar3;
  uint8_t *local_90;
  size_t local_88;
  uint8_t *local_80;
  size_t local_78;
  int local_6c;
  uint8_t *puStack_68;
  int ret;
  uint8_t *secbytes;
  uint8_t *pub;
  uint8_t priv [32];
  ptls_iovec_t *secret_local;
  ptls_iovec_t *pubkey_local;
  ptls_key_exchange_algorithm_t *algo_local;
  ptls_iovec_t peerkey_local;
  
  secbytes = (uint8_t *)0x0;
  puStack_68 = (uint8_t *)0x0;
  if ((peerkey.len == 0x41) && (*peerkey.base == '\x04')) {
    secbytes = (uint8_t *)malloc(0x41);
    if (secbytes == (uint8_t *)0x0) {
      local_6c = 0x201;
    }
    else {
      puStack_68 = (uint8_t *)malloc(0x20);
      if (puStack_68 == (uint8_t *)0x0) {
        local_6c = 0x201;
      }
      else {
        *secbytes = '\x04';
        puVar2 = uECC_secp256r1();
        uECC_make_key(secbytes + 1,(uint8_t *)&pub,puVar2);
        puVar2 = uECC_secp256r1();
        iVar1 = uECC_shared_secret(peerkey.base + 1,(uint8_t *)&pub,puStack_68,puVar2);
        if (iVar1 == 0) {
          local_6c = 0x33;
        }
        else {
          pVar3 = ptls_iovec_init(secbytes,0x41);
          local_80 = pVar3.base;
          pubkey->base = local_80;
          local_78 = pVar3.len;
          pubkey->len = local_78;
          pVar3 = ptls_iovec_init(puStack_68,0x20);
          local_90 = pVar3.base;
          secret->base = local_90;
          local_88 = pVar3.len;
          secret->len = local_88;
          local_6c = 0;
        }
      }
    }
  }
  else {
    local_6c = 0x33;
  }
  (*ptls_clear_memory)(&pub,0x20);
  if (local_6c != 0) {
    free(puStack_68);
    free(secbytes);
  }
  return local_6c;
}

Assistant:

static int secp256r1_key_exchange(ptls_key_exchange_algorithm_t *algo, ptls_iovec_t *pubkey, ptls_iovec_t *secret,
                                  ptls_iovec_t peerkey)
{
    uint8_t priv[SECP256R1_PRIVATE_KEY_SIZE], *pub = NULL, *secbytes = NULL;
    int ret;

    if (peerkey.len != SECP256R1_PUBLIC_KEY_SIZE || peerkey.base[0] != TYPE_UNCOMPRESSED_PUBLIC_KEY) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        goto Exit;
    }
    if ((pub = malloc(SECP256R1_PUBLIC_KEY_SIZE)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if ((secbytes = malloc(SECP256R1_SHARED_SECRET_SIZE)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

    pub[0] = TYPE_UNCOMPRESSED_PUBLIC_KEY;
    uECC_make_key(pub + 1, priv, uECC_secp256r1());
    if (!uECC_shared_secret(peerkey.base + 1, priv, secbytes, uECC_secp256r1())) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        goto Exit;
    }
    *pubkey = ptls_iovec_init(pub, SECP256R1_PUBLIC_KEY_SIZE);
    *secret = ptls_iovec_init(secbytes, SECP256R1_SHARED_SECRET_SIZE);
    ret = 0;

Exit:
    ptls_clear_memory(priv, sizeof(priv));
    if (ret != 0) {
        free(secbytes);
        free(pub);
    }
    return ret;
}